

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall Catch::Config::~Config(Config *this)

{
  (this->super_IConfig)._vptr_IConfig = (_func_int **)&PTR__Config_001a4270;
  TestSpec::~TestSpec(&this->m_testSpec);
  std::vector<Catch::ProcessedReporterSpec,_std::allocator<Catch::ProcessedReporterSpec>_>::~vector
            (&this->m_processedReporterSpecs);
  ConfigData::~ConfigData(&this->m_data);
  return;
}

Assistant:

Config::~Config() = default;